

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

queue_item * cod_find_index_abs(ev_state_data *ev_state,int queue,int index)

{
  queue_item *pqVar1;
  int iVar2;
  
  pqVar1 = ev_state->queue->queue_head;
  if (pqVar1 != (queue_item *)0x0) {
    iVar2 = index + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) goto LAB_001393a1;
      pqVar1 = pqVar1->next;
    } while (pqVar1 != (queue_item *)0x0);
  }
  pqVar1 = (queue_item *)0x0;
LAB_001393a1:
  if (pqVar1 != (queue_item *)0x0) {
    if ((-1 < queue) &&
       (pqVar1->item->reference_format !=
        *(FMFormat *)((long)(ev_state->instance->u).transform.client_data + (ulong)(uint)queue * 8))
       ) {
      pqVar1 = (queue_item *)0x0;
    }
    return pqVar1;
  }
  return (queue_item *)0x0;
}

Assistant:

static queue_item *cod_find_index_abs(struct ev_state_data *ev_state, int queue, int index) {
    queue_item *ret;
    ret = queue_find_index(ev_state->queue->queue_head, index, NULL);
    if (!ret)
        return NULL;
    if (queue < 0 || ret->item->reference_format ==
            ev_state->instance->u.queued.formats[queue])
        return ret;
    else
        return NULL;
}